

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_structs.hpp
# Opt level: O2

bool operator==(Derived2 *x,Derived2 *y)

{
  __type _Var1;
  
  if ((x->super_Derived1).super_Base2.super_Base1.a != (y->super_Derived1).super_Base2.super_Base1.a
     ) {
    return false;
  }
  if ((((x->super_Derived1).super_Base2.b == (y->super_Derived1).super_Base2.b) &&
      (_Var1 = std::operator==(&(x->super_Derived1).super_Base3.c,&(y->super_Derived1).super_Base3.c
                              ), _Var1)) && ((x->super_Derived1).d == (y->super_Derived1).d)) {
    return (x->super_Derived1).e == (y->super_Derived1).e;
  }
  return false;
}

Assistant:

bool operator==(const Derived2& x, const Derived2& y)
  {
    return x.a == y.a
      &&   x.b == y.b
      &&   x.c == y.c
      &&   x.d == y.d
      &&   x.e == y.e;
  }